

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_textedit_redo(nk_text_edit *state)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined2 uVar6;
  int pos;
  undefined2 uVar7;
  nk_text_undo_record *pnVar8;
  nk_rune nVar9;
  uint uVar10;
  long lVar11;
  int len;
  uint len_00;
  
  lVar11 = (long)(state->undo).redo_point;
  if (lVar11 != 99) {
    sVar1 = (state->undo).undo_point;
    pos = (state->undo).undo_rec[lVar11].where;
    sVar2 = (state->undo).undo_rec[lVar11].insert_length;
    len = (int)sVar2;
    sVar3 = (state->undo).undo_rec[lVar11].delete_length;
    len_00 = (uint)sVar3;
    sVar4 = (state->undo).undo_rec[lVar11].char_storage;
    (state->undo).undo_rec[sVar1].char_storage = -1;
    (state->undo).undo_rec[sVar1].delete_length = sVar2;
    (state->undo).undo_rec[sVar1].insert_length = sVar3;
    (state->undo).undo_rec[sVar1].where = pos;
    if (sVar3 != 0) {
      sVar5 = (state->undo).undo_char_point;
      if ((int)(state->undo).redo_char_point < (int)((int)sVar5 + len_00)) {
        pnVar8 = (state->undo).undo_rec + sVar1;
        pnVar8->insert_length = 0;
        pnVar8->delete_length = 0;
      }
      else {
        (state->undo).undo_rec[sVar1].char_storage = sVar5;
        (state->undo).undo_char_point = sVar5 + sVar3;
        uVar10 = len_00;
        for (lVar11 = 0; (int)lVar11 < (int)(short)uVar10; lVar11 = lVar11 + 1) {
          nVar9 = nk_str_rune_at(&state->string,(state->undo).undo_rec[sVar1].where + (int)lVar11);
          (state->undo).undo_char[(state->undo).undo_rec[sVar1].char_storage + lVar11] = nVar9;
          uVar10 = (uint)(ushort)(state->undo).undo_rec[sVar1].insert_length;
        }
      }
      nk_str_delete_runes(&state->string,pos,len_00);
    }
    if (sVar2 == 0) {
      len = 0;
    }
    else {
      nk_str_insert_text_runes(&state->string,pos,(state->undo).undo_char + sVar4,len);
    }
    state->cursor = pos + len;
    uVar6 = (state->undo).undo_point;
    uVar7 = (state->undo).redo_point;
    (state->undo).undo_point = uVar6 + 1;
    (state->undo).redo_point = uVar7 + 1;
  }
  return;
}

Assistant:

NK_API void
nk_textedit_redo(struct nk_text_edit *state)
{
struct nk_text_undo_state *s = &state->undo;
struct nk_text_undo_record *u, r;
if (s->redo_point == NK_TEXTEDIT_UNDOSTATECOUNT)
return;

/* we need to do two things: apply the redo record, and create an undo record */
u = &s->undo_rec[s->undo_point];
r = s->undo_rec[s->redo_point];

/* we KNOW there must be room for the undo record, because the redo record
    was derived from an undo record */
u->delete_length = r.insert_length;
u->insert_length = r.delete_length;
u->where = r.where;
u->char_storage = -1;

if (r.delete_length) {
/* the redo record requires us to delete characters, so the undo record
        needs to store the characters */
if (s->undo_char_point + u->insert_length > s->redo_char_point) {
u->insert_length = 0;
u->delete_length = 0;
} else {
int i;
u->char_storage = s->undo_char_point;
s->undo_char_point = (short)(s->undo_char_point + u->insert_length);

/* now save the characters */
for (i=0; i < u->insert_length; ++i) {
s->undo_char[u->char_storage + i] =
nk_str_rune_at(&state->string, u->where + i);
}
}
nk_str_delete_runes(&state->string, r.where, r.delete_length);
}

if (r.insert_length) {
/* easy case: need to insert n characters */
nk_str_insert_text_runes(&state->string, r.where,
&s->undo_char[r.char_storage], r.insert_length);
}
state->cursor = r.where + r.insert_length;

s->undo_point++;
s->redo_point++;
}